

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pow_tests.cpp
# Opt level: O3

void pow_tests::sanity_check_chainparams(ArgsManager *args,ChainType chain_type)

{
  long lVar1;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> uVar2;
  bool bVar3;
  readonly_property<bool> rVar4;
  int iVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  check_type cVar10;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 local_2ac [4];
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> chainParams;
  bool over;
  char *local_258 [2];
  undefined1 local_248 [16];
  shared_count sStack_238;
  bool neg;
  undefined1 local_228 [8];
  shared_ptr<boost::basic_wrap_stringstream<char>_> sStack_220;
  undefined8 uStack_210;
  undefined1 local_208 [8];
  shared_ptr<boost::basic_wrap_stringstream<char>_> sStack_200;
  _Base_ptr local_1f0;
  Params consensus;
  arith_uint256 targ_max;
  arith_uint256 pow_compact;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CreateChainParams((ArgsManager *)&chainParams,(ChainType)args);
  uVar2 = chainParams;
  consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)
        chainParams._M_t.
        super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>._M_t.
        super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>.
        super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl;
  consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)
        ((long)chainParams._M_t.
               super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>.
               _M_t.
               super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
               .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 8);
  consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)
        ((long)chainParams._M_t.
               super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>.
               _M_t.
               super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
               .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x10);
  consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)
        ((long)chainParams._M_t.
               super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>.
               _M_t.
               super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
               .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x18);
  consensus.nSubsidyHalvingInterval =
       *(int *)((long)chainParams._M_t.
                      super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                      .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x20);
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_unsigned_int>,_std::_Select1st<std::pair<const_uint256,_unsigned_int>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
  ::_Rb_tree(&consensus.script_flag_exceptions._M_t,
             (_Rb_tree<uint256,_std::pair<const_uint256,_unsigned_int>,_std::_Select1st<std::pair<const_uint256,_unsigned_int>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
              *)((long)chainParams._M_t.
                       super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                       .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x28));
  memcpy(&consensus.BIP34Height,
         (void *)((long)uVar2._M_t.
                        super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                        .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x58),
         0xf9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&consensus.signet_challenge,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)uVar2._M_t.
                    super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                    .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x158));
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xa5;
  file.m_begin = (iterator)&local_278;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_288,msg);
  sStack_200.px = (element_type *)(sStack_200._1_8_ << 8);
  local_208 = (undefined1  [8])&PTR__lazy_ostream_013ae088;
  sStack_200.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1f0 = (_Base_ptr)0xf73bdc;
  CBlockHeader::GetHash
            ((uint256 *)local_228,
             (CBlockHeader *)
             ((long)chainParams._M_t.
                    super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                    .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x248));
  auVar9[0] = -((uchar)sStack_220.pn.pi_ ==
               consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar9[1] = -(sStack_220.pn.pi_._1_1_ ==
               consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar9[2] = -(sStack_220.pn.pi_._2_1_ ==
               consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar9[3] = -(sStack_220.pn.pi_._3_1_ ==
               consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar9[4] = -(sStack_220.pn.pi_._4_1_ ==
               consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar9[5] = -(sStack_220.pn.pi_._5_1_ ==
               consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar9[6] = -(sStack_220.pn.pi_._6_1_ ==
               consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar9[7] = -(sStack_220.pn.pi_._7_1_ ==
               consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar9[8] = -((uchar)uStack_210 ==
               consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar9[9] = -(uStack_210._1_1_ ==
               consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar9[10] = -(uStack_210._2_1_ ==
                consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar9[0xb] = -(uStack_210._3_1_ ==
                 consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar9[0xc] = -(uStack_210._4_1_ ==
                 consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar9[0xd] = -(uStack_210._5_1_ ==
                 consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar9[0xe] = -(uStack_210._6_1_ ==
                 consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar9[0xf] = -(uStack_210._7_1_ ==
                 consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar8[0] = -(local_228[0] ==
               (readonly_property<bool>)
               consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0]);
  auVar8[1] = -(local_228[1] == consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[1])
  ;
  auVar8[2] = -(local_228[2] == consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[2])
  ;
  auVar8[3] = -(local_228[3] == consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[3])
  ;
  auVar8[4] = -(local_228[4] == consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[4])
  ;
  auVar8[5] = -(local_228[5] == consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[5])
  ;
  auVar8[6] = -(local_228[6] == consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[6])
  ;
  auVar8[7] = -(local_228[7] == consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[7])
  ;
  auVar8[8] = -(sStack_220.px._0_1_ ==
               (bool)consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[8]);
  auVar8[9] = -(sStack_220.px._1_1_ ==
               consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[9]);
  auVar8[10] = -(sStack_220.px._2_1_ ==
                consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[10]);
  auVar8[0xb] = -(sStack_220.px._3_1_ ==
                 consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar8[0xc] = -(sStack_220.px._4_1_ ==
                 consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar8[0xd] = -(sStack_220.px._5_1_ ==
                 consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar8[0xe] = -(sStack_220.px._6_1_ ==
                 consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar8[0xf] = -(sStack_220.px._7_1_ ==
                 consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar8 = auVar8 & auVar9;
  local_248[0] = (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff;
  local_248._8_8_ = (element_type *)0x0;
  sStack_238.pi_ = (sp_counted_base *)0x0;
  local_258[0] = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_258[1] = "";
  pow_compact.super_base_uint<256U>.pn[2]._0_1_ = 0;
  pow_compact.super_base_uint<256U>.pn._0_8_ = &PTR__lazy_ostream_013aed38;
  pow_compact.super_base_uint<256U>.pn._16_8_ = boost::unit_test::lazy_ostream::inst;
  targ_max.super_base_uint<256U>.pn[2]._0_1_ = 0;
  targ_max.super_base_uint<256U>.pn._0_8_ = &PTR__lazy_ostream_013aed38;
  targ_max.super_base_uint<256U>.pn._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  _over = (uint256 *)local_228;
  _neg = &consensus;
  targ_max.super_base_uint<256U>.pn._24_8_ = &over;
  pow_compact.super_base_uint<256U>.pn._24_8_ = &neg;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_248,(lazy_ostream *)local_208,1,2,REQUIRE,0xec1f1b,
             (size_t)local_258,0xa5,&pow_compact,"chainParams->GenesisBlock().GetHash()",&targ_max);
  boost::detail::shared_count::~shared_count(&sStack_238);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xa8;
  file_00.m_begin = (iterator)&local_298;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2a8,
             msg_00);
  sStack_200.px = (element_type *)(sStack_200._1_8_ << 8);
  local_208 = (undefined1  [8])&PTR__lazy_ostream_013ae088;
  sStack_200.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1f0 = (_Base_ptr)0xf73bdc;
  _over = consensus.nPowTargetTimespan % consensus.nPowTargetSpacing;
  _neg = (Params *)local_2ac;
  local_2ac = (undefined1  [4])0x0;
  local_228[0] = (readonly_property<bool>)(readonly_property<bool>)(_over == 0);
  sStack_220.px = (element_type *)0x0;
  sStack_220.pn.pi_ = (sp_counted_base *)0x0;
  local_248._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp"
  ;
  local_248._8_8_ = (element_type *)0xec1c2c;
  pow_compact.super_base_uint<256U>.pn[2]._0_1_ = 0;
  pow_compact.super_base_uint<256U>.pn._0_8_ = &PTR__lazy_ostream_013ae428;
  pow_compact.super_base_uint<256U>.pn._24_8_ = local_258;
  pow_compact.super_base_uint<256U>.pn._16_8_ = boost::unit_test::lazy_ostream::inst;
  targ_max.super_base_uint<256U>.pn[2]._0_1_ = 0;
  targ_max.super_base_uint<256U>.pn._0_8_ = &PTR__lazy_ostream_013ae248;
  targ_max.super_base_uint<256U>.pn._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_258[0] = &over;
  targ_max.super_base_uint<256U>.pn._24_8_ = &neg;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_228,(lazy_ostream *)local_208,1,2,REQUIRE,0xec1f5c,
             (size_t)local_248,0xa8,&pow_compact,"0",&targ_max);
  boost::detail::shared_count::~shared_count(&sStack_220.pn);
  pow_compact.super_base_uint<256U>.pn[4] = 0;
  pow_compact.super_base_uint<256U>.pn[5] = 0;
  pow_compact.super_base_uint<256U>.pn[6] = 0;
  pow_compact.super_base_uint<256U>.pn[7] = 0;
  pow_compact.super_base_uint<256U>.pn[0] = 0;
  pow_compact.super_base_uint<256U>.pn[1] = 0;
  pow_compact.super_base_uint<256U>.pn[2] = 0;
  pow_compact.super_base_uint<256U>.pn[3] = 0;
  arith_uint256::SetCompact
            (&pow_compact,
             *(uint32_t *)
              ((long)chainParams._M_t.
                     super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                     .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl + 0x290),&neg,
             &over);
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x51c811;
  file_01.m_end = (iterator)0xae;
  file_01.m_begin = (iterator)&local_2c0;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2d0,
             msg_01);
  if (neg == false) {
    _cVar10 = 0x51c82e;
    bVar3 = base_uint<256U>::EqualTo(&pow_compact.super_base_uint<256U>,0);
    rVar4.super_class_property<bool>.value = (class_property<bool>)!bVar3;
  }
  else {
    rVar4.super_class_property<bool>.value = (class_property<bool>)false;
  }
  sStack_200.px = (element_type *)0x0;
  sStack_200.pn.pi_ = (sp_counted_base *)0x0;
  local_228 = (undefined1  [8])0xec1f97;
  sStack_220.px = (element_type *)0xec1faf;
  targ_max.super_base_uint<256U>.pn[2]._0_1_ = 0;
  targ_max.super_base_uint<256U>.pn._0_8_ = &PTR__lazy_ostream_013ae1c8;
  targ_max.super_base_uint<256U>.pn._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_2d8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  targ_max.super_base_uint<256U>.pn._24_8_ = (assertion_result *)local_228;
  local_208[0] = rVar4.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_208,(lazy_ostream *)&targ_max,1,0,WARN,_cVar10,
             (size_t)&local_2e0,0xae);
  boost::detail::shared_count::~shared_count(&sStack_200.pn);
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x51c8e6;
  file_02.m_end = (iterator)0xaf;
  file_02.m_begin = (iterator)&local_2f0;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_300,
             msg_02);
  local_208 = (undefined1  [8])(CONCAT71(local_208._1_7_,over) ^ 1);
  sStack_200.px = (element_type *)0x0;
  sStack_200.pn.pi_ = (sp_counted_base *)0x0;
  local_228 = (undefined1  [8])0xec1fb0;
  sStack_220.px = (element_type *)0xec1fb5;
  targ_max.super_base_uint<256U>.pn[2]._0_1_ = 0;
  targ_max.super_base_uint<256U>.pn._0_8_ = &PTR__lazy_ostream_013ae1c8;
  targ_max.super_base_uint<256U>.pn._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_308 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  targ_max.super_base_uint<256U>.pn._24_8_ = (assertion_result *)local_228;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_208,(lazy_ostream *)&targ_max,1,0,WARN,_cVar10,
             (size_t)&local_310,0xaf);
  boost::detail::shared_count::~shared_count(&sStack_200.pn);
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xb0;
  file_03.m_begin = (iterator)&local_320;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_330,
             msg_03);
  UintToArith256(&targ_max,&consensus.powLimit);
  _cVar10 = 0x51c9c5;
  iVar5 = base_uint<256U>::CompareTo
                    (&targ_max.super_base_uint<256U>,&pow_compact.super_base_uint<256U>);
  local_228[0] = (readonly_property<bool>)(readonly_property<bool>)(-1 < iVar5);
  sStack_220.px = (element_type *)0x0;
  sStack_220.pn.pi_ = (sp_counted_base *)0x0;
  local_248._0_8_ = "UintToArith256(consensus.powLimit) >= pow_compact";
  local_248._8_8_ = (element_type *)0xec1fe7;
  sStack_200.px = (element_type *)(sStack_200._1_8_ << 8);
  local_208 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
  sStack_200.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1f0 = (_Base_ptr)local_248;
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_338 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_228,(lazy_ostream *)local_208,1,0,WARN,_cVar10,
             (size_t)&local_340,0xb0);
  boost::detail::shared_count::~shared_count(&sStack_220.pn);
  if (consensus.fPowNoRetargeting == false) {
    sStack_200.pn.pi_._0_4_ = 0xffffffff;
    sStack_200.pn.pi_._4_4_ = 0xffffffff;
    local_1f0 = (_Base_ptr)0xffffffffffffffff;
    local_208 = (undefined1  [8])0xffffffffffffffff;
    sStack_200.px = (element_type *)0xffffffffffffffff;
    UintToArith256(&targ_max,(uint256 *)local_208);
    local_208._4_4_ = (int)((ulong)consensus.nPowTargetTimespan >> 0x1e);
    local_208._0_4_ = (int)consensus.nPowTargetTimespan * 4;
    sStack_200.px = (element_type *)0x0;
    sStack_200.pn.pi_ = (sp_counted_base *)0x0;
    local_1f0 = (_Base_ptr)0x0;
    base_uint<256U>::operator/=(&targ_max.super_base_uint<256U>,(base_uint<256U> *)local_208);
    local_350 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
    local_348 = "";
    local_360 = &boost::unit_test::basic_cstring<char_const>::null;
    local_358 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0xb6;
    file_04.m_begin = (iterator)&local_350;
    msg_04.m_end = pvVar7;
    msg_04.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_360,
               msg_04);
    UintToArith256((arith_uint256 *)local_208,&consensus.powLimit);
    _cVar10 = 0x51cb0c;
    iVar5 = base_uint<256U>::CompareTo((base_uint<256U> *)local_208,&targ_max.super_base_uint<256U>)
    ;
    local_248[0] = (byte)((uint)iVar5 >> 0x1f);
    local_248._8_8_ = (element_type *)0x0;
    sStack_238.pi_ = (sp_counted_base *)0x0;
    local_258[0] = "UintToArith256(consensus.powLimit) < targ_max";
    local_258[1] = "";
    sStack_220.px = (element_type *)(sStack_220._1_8_ << 8);
    local_228 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
    sStack_220.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    uStack_210 = local_258;
    local_370 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
    local_368 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_248,(lazy_ostream *)local_228,1,0,WARN,_cVar10,
               (size_t)&local_370,0xb6);
    boost::detail::shared_count::~shared_count(&sStack_238);
  }
  if (consensus.signet_challenge.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(consensus.signet_challenge.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)consensus.signet_challenge.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)consensus.signet_challenge.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_unsigned_int>,_std::_Select1st<std::pair<const_uint256,_unsigned_int>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
  ::~_Rb_tree(&consensus.script_flag_exceptions._M_t);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            (&chainParams);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void sanity_check_chainparams(const ArgsManager& args, ChainType chain_type)
{
    const auto chainParams = CreateChainParams(args, chain_type);
    const auto consensus = chainParams->GetConsensus();

    // hash genesis is correct
    BOOST_CHECK_EQUAL(consensus.hashGenesisBlock, chainParams->GenesisBlock().GetHash());

    // target timespan is an even multiple of spacing
    BOOST_CHECK_EQUAL(consensus.nPowTargetTimespan % consensus.nPowTargetSpacing, 0);

    // genesis nBits is positive, doesn't overflow and is lower than powLimit
    arith_uint256 pow_compact;
    bool neg, over;
    pow_compact.SetCompact(chainParams->GenesisBlock().nBits, &neg, &over);
    BOOST_CHECK(!neg && pow_compact != 0);
    BOOST_CHECK(!over);
    BOOST_CHECK(UintToArith256(consensus.powLimit) >= pow_compact);

    // check max target * 4*nPowTargetTimespan doesn't overflow -- see pow.cpp:CalculateNextWorkRequired()
    if (!consensus.fPowNoRetargeting) {
        arith_uint256 targ_max{UintToArith256(uint256{"ffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffff"})};
        targ_max /= consensus.nPowTargetTimespan*4;
        BOOST_CHECK(UintToArith256(consensus.powLimit) < targ_max);
    }
}